

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

string * tinyusdz::io::ExpandFilePath
                   (string *__return_storage_ptr__,string *_filepath,void *param_2)

{
  ulong uVar1;
  char *pcVar2;
  allocator local_e9;
  string local_e8 [36];
  int local_c4;
  undefined1 local_c0 [4];
  int ret;
  undefined1 local_a0 [8];
  string quoted_path;
  undefined1 local_78 [8];
  wordexp_t p;
  string s;
  string filepath;
  void *param_1_local;
  string *_filepath_local;
  
  ::std::__cxx11::string::string((string *)(s.field_2._M_local_buf + 8),(string *)_filepath);
  uVar1 = ::std::__cxx11::string::size();
  if (0x800 < uVar1) {
    ::std::__cxx11::string::resize((ulong)((long)&s.field_2 + 8));
  }
  ::std::__cxx11::string::string((string *)&p.we_offs);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     "\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&s.field_2 + 8));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     "\"");
    ::std::__cxx11::string::~string((string *)local_c0);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    local_c4 = wordexp(pcVar2,(wordexp_t *)local_78,4);
    if (local_c4 == 0) {
      if (p.we_wordc == 0) {
        ::std::__cxx11::string::operator=
                  ((string *)&p.we_offs,(string *)(s.field_2._M_local_buf + 8));
      }
      else {
        pcVar2 = *(char **)p.we_wordc;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_e8,pcVar2,&local_e9);
        ::std::__cxx11::string::operator=((string *)&p.we_offs,local_e8);
        ::std::__cxx11::string::~string(local_e8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        wordfree((wordexp_t *)local_78);
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&p.we_offs);
    }
    else {
      ::std::__cxx11::string::operator=((string *)&p.we_offs,(string *)(s.field_2._M_local_buf + 8))
      ;
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&p.we_offs);
    }
    quoted_path.field_2._8_4_ = 1;
    ::std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",
               (allocator *)(quoted_path.field_2._M_local_buf + 0xf));
    ::std::allocator<char>::~allocator((allocator<char> *)(quoted_path.field_2._M_local_buf + 0xf));
    quoted_path.field_2._8_4_ = 1;
  }
  ::std::__cxx11::string::~string((string *)&p.we_offs);
  ::std::__cxx11::string::~string((string *)(s.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ExpandFilePath(const std::string &_filepath, void *) {
  std::string filepath = _filepath;
  if (filepath.size() > 2048) {
    // file path too large.
    // TODO: Report warn.
    filepath.resize(2048);
  }

#ifdef _WIN32
  // Assume input `filepath` is encoded in UTF-8
  std::wstring wfilepath = UTF8ToWchar(filepath);
  DWORD wlen = ExpandEnvironmentStringsW(wfilepath.c_str(), nullptr, 0);
  wchar_t *wstr = new wchar_t[wlen];
  ExpandEnvironmentStringsW(wfilepath.c_str(), wstr, wlen);

  std::wstring ws(wstr);
  delete[] wstr;
  return WcharToUTF8(ws);

#else

#if defined(TINYUSDZ_BUILD_IOS) || defined(TARGET_OS_IPHONE) || \
    defined(TARGET_IPHONE_SIMULATOR) || defined(__ANDROID__) || \
    defined(__EMSCRIPTEN__) || defined(__OpenBSD__) || defined(__wasi__)
  // no expansion
  std::string s = filepath;
#else
  std::string s;
  wordexp_t p;

  if (filepath.empty()) {
    return "";
  }

  // Quote the string to keep any spaces in filepath intact.
  std::string quoted_path = "\"" + filepath + "\"";
  // char** w;
  // TODO: wordexp() is a awful API. Implement our own file path expansion
  // routine. Set NOCMD for security.
  int ret = wordexp(quoted_path.c_str(), &p, WRDE_NOCMD);
  if (ret) {
    // err
    s = filepath;
    return s;
  }

  // Use first element only.
  if (p.we_wordv) {
    s = std::string(p.we_wordv[0]);
    wordfree(&p);
  } else {
    s = filepath;
  }

#endif

  return s;
#endif
}